

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O0

char * TEST_triple_parse_unknown(void)

{
  int iVar1;
  uint uVar2;
  char **local_a0;
  size_t k;
  char *s;
  undefined4 local_88;
  float c;
  int b;
  int a;
  char **unknown_opts;
  size_t unknown_count;
  char *unknown_opts_expect [1];
  char *args3 [2];
  char *local_50;
  char *args2 [1];
  char *args [3];
  cargo_t local_28;
  cargo_t cargo;
  char *pcStack_18;
  int ret;
  char *msg;
  
  pcStack_18 = (char *)0x0;
  cargo._4_4_ = 0;
  iVar1 = cargo_init(&local_28,0,"program");
  if (iVar1 == 0) {
    args2[0] = "program";
    local_50 = "program";
    unknown_opts_expect[0] = "program";
    unknown_count = (size_t)anon_var_dwarf_40b7;
    unknown_opts = (char **)0x0;
    _b = (char **)0x0;
    c = 0.0;
    local_88 = 0;
    s._4_4_ = 0x40e00000;
    k = (size_t)strdup("abc");
    if ((char *)k == (char *)0x0) {
      pcStack_18 = "Failed to allocate";
    }
    else {
      uVar2 = cargo_add_option(local_28,0,"--alpha -a","an option","i",&c);
      cargo._4_4_ = uVar2 | cargo._4_4_;
      uVar2 = cargo_add_option(local_28,0,"--beta -b","another option","i",&local_88);
      cargo._4_4_ = uVar2 | cargo._4_4_;
      uVar2 = cargo_add_option(local_28,0,"--centauri -c","another option","f",(long)&s + 4);
      cargo._4_4_ = uVar2 | cargo._4_4_;
      uVar2 = cargo_add_option(local_28,0,"--delta -d","another option","s",&k);
      cargo._4_4_ = uVar2 | cargo._4_4_;
      cargo._4_4_ = cargo_parse(local_28,CARGO_SKIP_CHECK_UNKNOWN,1,3,args2);
      if (cargo._4_4_ == 0) {
        if ((k == 0) || (iVar1 = strcmp((char *)k,"abc"), iVar1 != 0)) {
          pcStack_18 = "Expected s to be \'abc\'";
        }
        else {
          cargo._4_4_ = cargo_parse(local_28,CARGO_SKIP_CHECK_UNKNOWN,1,1,&local_50);
          if (cargo._4_4_ == 0) {
            if ((k == 0) || (iVar1 = strcmp((char *)k,"abc"), iVar1 != 0)) {
              pcStack_18 = "Expected s to be \'abc\'";
            }
            else {
              cargo._4_4_ = cargo_parse(local_28,0,1,2,unknown_opts_expect);
              if ((int)cargo._4_4_ < 0) {
                _b = cargo_get_unknown(local_28,(size_t *)&unknown_opts);
                if (_b == (char **)0x0) {
                  pcStack_18 = "Got NULL unknown options";
                }
                else {
                  printf("Unknown option count = %lu\n",unknown_opts);
                  printf("Check that \"unknown_opts\" has 1 elements\n");
                  if (unknown_opts == (char **)0x1) {
                    for (local_a0 = (char **)0x0; local_a0 < unknown_opts;
                        local_a0 = (char **)((long)local_a0 + 1)) {
                      printf("  %lu: \"%s\" -> \"%s\"\n",(long)local_a0 + 1,_b[(long)local_a0],
                             unknown_opts_expect[(long)local_a0 - 1]);
                      iVar1 = strcmp(_b[(long)local_a0],unknown_opts_expect[(long)local_a0 - 1]);
                      if (iVar1 != 0) {
                        pcStack_18 = "Array contains unexpected value";
                        break;
                      }
                    }
                  }
                  else {
                    pcStack_18 = "unknown_opts array count unknown_count is not expected 1";
                  }
                }
              }
              else {
                pcStack_18 = "Parse did not fail 3";
              }
            }
          }
          else {
            pcStack_18 = "Parse failed 2";
          }
        }
      }
      else {
        pcStack_18 = "Parse failed 1";
      }
    }
    _cargo_xfree(&k);
    cargo_destroy(&local_28);
    msg = pcStack_18;
  }
  else {
    msg = "Failed to init cargo";
  }
  return msg;
}

Assistant:

_TEST_START(TEST_triple_parse_unknown)
{
    //
    // Specify two unknowns in different parses, but don't check for the first.
    //
    char *args[] = { "program", "--unknown1", "123" };
    char *args2[] = { "program" };
    char *args3[] = { "program", "--unknown2" };
    char *unknown_opts_expect[] = { "--unknown2" };
    size_t unknown_count = 0;
    const char **unknown_opts = NULL;
    int a = 0;
    int b = 0;
    float c = 7.0f;
    char *s = strdup("abc");
    cargo_assert(s, "Failed to allocate");

    ret |= cargo_add_option(cargo, 0, "--alpha -a", "an option", "i", &a);
    ret |= cargo_add_option(cargo, 0, "--beta -b", "another option", "i", &b);
    ret |= cargo_add_option(cargo, 0, "--centauri -c", "another option", "f", &c);
    ret |= cargo_add_option(cargo, 0, "--delta -d", "another option", "s", &s);

    ret = cargo_parse(cargo, CARGO_SKIP_CHECK_UNKNOWN, 1, sizeof(args) / sizeof(args[0]), args);
    cargo_assert(ret == 0, "Parse failed 1");
    cargo_assert(s && !strcmp(s, "abc"), "Expected s to be 'abc'");

    ret = cargo_parse(cargo, CARGO_SKIP_CHECK_UNKNOWN, 1, sizeof(args2) / sizeof(args2[0]), args2);
    cargo_assert(ret == 0, "Parse failed 2");
    cargo_assert(s && !strcmp(s, "abc"), "Expected s to be 'abc'");

    ret = cargo_parse(cargo, 0, 1, sizeof(args3) / sizeof(args3[0]), args3);
    cargo_assert(ret < 0, "Parse did not fail 3");

    // Get unknown options.
    unknown_opts = cargo_get_unknown(cargo, &unknown_count);
    cargo_assert(unknown_opts != NULL, "Got NULL unknown options");

    printf("Unknown option count = %lu\n", unknown_count);
    cargo_assert_str_array(unknown_count, 1, unknown_opts, unknown_opts_expect);


    _TEST_CLEANUP();
    _cargo_xfree(&s);
}